

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

aiNodeAnim * __thiscall
Assimp::FBX::FBXConverter::GenerateSimpleNodeAnim
          (FBXConverter *this,string *name,Model *target,const_iterator *chain,
          const_iterator iter_end,LayerMap *layer_map,int64_t start,int64_t stop,double *max_time,
          double *min_time,bool reverse_order)

{
  pointer *pptVar1;
  _Rb_tree_color _Var2;
  PropertyTable *this_00;
  _Base_ptr p_Var3;
  undefined1 auVar4 [16];
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> uVar5;
  pointer plVar6;
  pointer plVar7;
  RotOrder RVar8;
  undefined4 uVar9;
  __uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true> na_00;
  Property *pPVar10;
  long lVar11;
  KeyFrameListList *pKVar12;
  aiQuatKey *out_quat;
  aiVectorKey *paVar13;
  aiVectorKey *out_translation;
  LayerMap *pLVar14;
  undefined8 *puVar15;
  aiQuatKey *paVar16;
  LayerMap *pLVar17;
  ulong uVar18;
  ulong uVar19;
  pointer_____offset_0x10___ *this_01;
  FBXConverter *this_02;
  aiQuaternion aVar20;
  KeyFrameListList joined;
  KeyFrameListList scaling;
  unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_> na;
  KeyFrameListList translation;
  KeyTimeList local_a0;
  KeyFrameListList rotation;
  _Base_ptr local_60;
  float local_58;
  _Base_ptr local_50;
  float local_48;
  pointer local_40;
  float local_38;
  
  this_01 = (pointer_____offset_0x10___ *)&joined;
  pLVar17 = (LayerMap *)chain;
  na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
       (__uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>)operator_new(0x438);
  *(undefined4 *)
   na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
   super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
   super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl = 0;
  *(char *)((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 4) = '\0';
  memset((char *)((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                        _M_t.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                        super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 5),0x1b,0x3ff);
  *(aiQuatKey **)
   ((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x418) = (aiQuatKey *)0x0;
  *(uint *)((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x420) = 0;
  *(undefined8 *)
   ((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x404) = 0;
  *(undefined8 *)
   ((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x40c) = 0;
  *(aiVectorKey **)
   ((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x428) = (aiVectorKey *)0x0;
  *(undefined8 *)
   ((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x430) = 0;
  uVar19 = name->_M_string_length;
  na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)
       (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)
       na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
       super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
       super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl;
  if (uVar19 < 0x400) {
    *(int *)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
            super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
            super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl = (int)uVar19;
    memcpy((char *)((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                          _M_t.
                          super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                          super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 4),
           (name->_M_dataplus)._M_p,uVar19);
    ((char *)((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
                    super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                    super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 4))[uVar19] = '\0';
  }
  this_00 = (target->props).
            super___shared_ptr<const_Assimp::FBX::PropertyTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (this_00 == (PropertyTable *)0x0) {
    __assert_fail("props.get()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/FBX/FBXDocument.h"
                  ,0x1b4,"const PropertyTable &Assimp::FBX::Model::Props() const");
  }
  if (reverse_order) {
    pptVar1 = &joined.
               super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    joined.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pptVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&joined,"Lcl Scaling","");
    scaling.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f8000003f800000;
    scaling.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)CONCAT44(scaling.
                           super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish._4_4_,0x3f800000);
    pPVar10 = PropertyTable::Get(this_00,(string *)&joined);
    if (pPVar10 == (Property *)0x0) {
      pKVar12 = &scaling;
    }
    else {
      lVar11 = __dynamic_cast(pPVar10,&Property::typeinfo,
                              &TypedProperty<aiVector3t<float>>::typeinfo,0);
      pKVar12 = &scaling;
      if (lVar11 != 0) {
        pKVar12 = (KeyFrameListList *)(lVar11 + 8);
      }
    }
    local_38 = *(float *)&(pKVar12->
                          super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
    local_40 = (pKVar12->
               super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    if (joined.
        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)pptVar1) {
      operator_delete(joined.
                      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((joined.
                                       super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                     ).
                                     super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                     .super__Tuple_impl<2UL,_unsigned_int>.
                                     super__Head_base<2UL,_unsigned_int,_false>._M_head_impl + 1));
    }
    joined.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pptVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&joined,"Lcl Translation","");
    scaling.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    scaling.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((ulong)scaling.
                          super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
    pPVar10 = PropertyTable::Get(this_00,(string *)&joined);
    if (pPVar10 == (Property *)0x0) {
      pKVar12 = &scaling;
    }
    else {
      lVar11 = __dynamic_cast(pPVar10,&Property::typeinfo,
                              &TypedProperty<aiVector3t<float>>::typeinfo,0);
      pKVar12 = &scaling;
      if (lVar11 != 0) {
        pKVar12 = (KeyFrameListList *)(lVar11 + 8);
      }
    }
    local_48 = *(float *)&(pKVar12->
                          super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
    local_50 = (_Base_ptr)
               (pKVar12->
               super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    if (joined.
        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)pptVar1) {
      operator_delete(joined.
                      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (ulong)((long)&((joined.
                                       super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                     super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                     ).
                                     super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                     .super__Tuple_impl<2UL,_unsigned_int>.
                                     super__Head_base<2UL,_unsigned_int,_false>._M_head_impl + 1));
    }
    joined.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)pptVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&joined,"Lcl Rotation","");
    scaling.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    scaling.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)((ulong)scaling.
                          super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
    pPVar10 = PropertyTable::Get(this_00,(string *)&joined);
    if (pPVar10 == (Property *)0x0) {
      pKVar12 = &scaling;
    }
    else {
      this_01 = &Property::typeinfo;
      lVar11 = __dynamic_cast(pPVar10,&Property::typeinfo,
                              &TypedProperty<aiVector3t<float>>::typeinfo,0);
      pKVar12 = &scaling;
      if (lVar11 != 0) {
        pKVar12 = (KeyFrameListList *)(lVar11 + 8);
      }
    }
    local_58 = *(float *)&(pKVar12->
                          super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish;
    local_60 = (_Base_ptr)
               (pKVar12->
               super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    if (joined.
        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)pptVar1) {
      this_01 = (pointer_____offset_0x10___ *)
                ((long)&((joined.
                          super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                        super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                        ).
                        super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                        .super__Tuple_impl<2UL,_unsigned_int>.
                        super__Head_base<2UL,_unsigned_int,_false>._M_head_impl + 1);
      operator_delete(joined.
                      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,(ulong)this_01);
    }
    scaling.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    scaling.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    scaling.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    translation.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    translation.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    translation.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    rotation.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    rotation.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    rotation.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    if (chain[0xc]._M_node != iter_end._M_node) {
      GetKeyframeList((KeyFrameListList *)&local_a0,(FBXConverter *)this_01,
                      (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                       *)(chain[0xc]._M_node + 2),start,stop);
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           scaling.
           super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           scaling.
           super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           scaling.
           super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      scaling.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)local_a0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start;
      scaling.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)local_a0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      scaling.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)local_a0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      local_a0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_a0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_a0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ::~vector(&joined);
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ::~vector((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 *)&local_a0);
    }
    if (chain[3]._M_node != iter_end._M_node) {
      GetKeyframeList((KeyFrameListList *)&local_a0,(FBXConverter *)this_01,
                      (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                       *)(chain[3]._M_node + 2),start,stop);
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           translation.
           super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           translation.
           super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           translation.
           super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      translation.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)local_a0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start;
      translation.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)local_a0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      translation.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)local_a0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      local_a0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_a0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_a0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ::~vector(&joined);
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ::~vector((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 *)&local_a0);
    }
    if (chain[7]._M_node != iter_end._M_node) {
      GetKeyframeList((KeyFrameListList *)&local_a0,(FBXConverter *)this_01,
                      (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                       *)(chain[7]._M_node + 2),start,stop);
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           rotation.
           super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           rotation.
           super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           rotation.
           super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      rotation.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)local_a0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start;
      rotation.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)local_a0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_finish;
      rotation.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)local_a0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage;
      local_a0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_a0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_a0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ::~vector(&joined);
      std::
      vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ::~vector((vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 *)&local_a0);
    }
    joined.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    joined.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    joined.
    super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
    ::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>*,std::vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>>>
              ((vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
                *)&joined,0,
               scaling.
               super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               scaling.
               super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
    ::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>*,std::vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>>>
              ((vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
                *)&joined,
               joined.
               super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               translation.
               super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               translation.
               super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    this_02 = (FBXConverter *)
              joined.
              super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
    ::
    _M_range_insert<__gnu_cxx::__normal_iterator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>*,std::vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>>>
              ((vector<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>,std::allocator<std::tuple<std::shared_ptr<std::vector<long,std::allocator<long>>>,std::shared_ptr<std::vector<float,std::allocator<float>>>,unsigned_int>>>
                *)&joined,
               joined.
               super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,
               rotation.
               super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               rotation.
               super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    GetKeyTimeList(&local_a0,this_02,&joined);
    plVar7 = local_a0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    plVar6 = local_a0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar18 = (long)local_a0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)local_a0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = uVar18;
    uVar19 = 0xffffffffffffffff;
    if (SUB168(auVar4 * ZEXT816(0x18),8) == 0) {
      uVar19 = SUB168(auVar4 * ZEXT816(0x18),0);
    }
    out_quat = (aiQuatKey *)operator_new__(uVar19);
    if (plVar7 != plVar6) {
      paVar16 = out_quat;
      do {
        paVar16->mTime = 0.0;
        (paVar16->mValue).w = 1.0;
        (paVar16->mValue).x = 0.0;
        (paVar16->mValue).y = 0.0;
        (paVar16->mValue).z = 0.0;
        paVar16 = paVar16 + 1;
      } while (paVar16 != out_quat + uVar18);
    }
    paVar13 = (aiVectorKey *)operator_new__(uVar19);
    if (plVar7 != plVar6) {
      lVar11 = 0;
      do {
        puVar15 = (undefined8 *)((long)&paVar13->mTime + lVar11);
        *puVar15 = 0;
        puVar15[1] = 0;
        *(undefined4 *)((long)&(paVar13->mValue).z + lVar11) = 0;
        lVar11 = lVar11 + 0x18;
      } while (uVar18 * 0x18 != lVar11);
    }
    out_translation = (aiVectorKey *)operator_new__(uVar19);
    if (plVar7 != plVar6) {
      lVar11 = 0;
      do {
        puVar15 = (undefined8 *)((long)&out_translation->mTime + lVar11);
        *puVar15 = 0;
        puVar15[1] = 0;
        *(undefined4 *)((long)&(out_translation->mValue).z + lVar11) = 0;
        lVar11 = lVar11 + 0x18;
      } while (uVar18 * 0x18 != lVar11);
      if (plVar7 != plVar6) {
        RVar8 = Model::RotationOrder(target);
        ConvertTransformOrder_TRStoSRT
                  (this,out_quat,paVar13,out_translation,&scaling,&translation,&rotation,&local_a0,
                   max_time,min_time,RVar8,(aiVector3D *)&local_40,(aiVector3D *)&local_50,
                   (aiVector3D *)&local_60);
      }
    }
    uVar9 = (undefined4)
            ((ulong)((long)local_a0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)local_a0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 3);
    *(undefined4 *)
     ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
            super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
            super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x420) = uVar9;
    *(undefined4 *)
     ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
            super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
            super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x410) = uVar9;
    *(undefined4 *)
     ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
            super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
            super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x404) = uVar9;
    *(aiVectorKey **)
     ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
            super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
            super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x428) = paVar13;
    *(aiQuatKey **)
     ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
            super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
            super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x418) = out_quat;
    *(aiVectorKey **)
     ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
            super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
            super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x408) = out_translation;
    if ((pointer)local_a0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                 super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_a0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_a0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_a0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ::~vector(&joined);
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ::~vector(&rotation);
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ::~vector(&translation);
    std::
    vector<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
    ::~vector(&scaling);
  }
  else {
    if (chain[0xc]._M_node == iter_end._M_node) {
      paVar13 = (aiVectorKey *)operator_new__(0x18);
      paVar13->mTime = 0.0;
      (paVar13->mValue).x = 0.0;
      (paVar13->mValue).y = 0.0;
      (paVar13->mValue).z = 0.0;
      *(aiVectorKey **)
       ((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
              super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
              super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x428) = paVar13;
      *(uint *)((long)na_00.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t
                      .super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                      super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x420) = 1;
      paVar13->mTime = 0.0;
      pptVar1 = &joined.
                 super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pptVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&joined,"Lcl Scaling","");
      scaling.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x3f8000003f800000;
      scaling.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(scaling.
                             super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,0x3f800000);
      pPVar10 = PropertyTable::Get(this_00,(string *)&joined);
      if (pPVar10 == (Property *)0x0) {
        pLVar14 = (LayerMap *)&scaling;
      }
      else {
        lVar11 = __dynamic_cast(pPVar10,&Property::typeinfo,
                                &TypedProperty<aiVector3t<float>>::typeinfo,0);
        pLVar17 = (LayerMap *)(lVar11 + 8);
        pLVar14 = (LayerMap *)&scaling;
        if (lVar11 != 0) {
          pLVar14 = pLVar17;
        }
      }
      _Var2 = (pLVar14->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color;
      lVar11 = *(long *)((long)na._M_t.
                               super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>
                               .super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x428);
      *(undefined8 *)(lVar11 + 8) = *(undefined8 *)&(pLVar14->_M_t)._M_impl;
      *(_Rb_tree_color *)(lVar11 + 0x10) = _Var2;
      if (joined.
          super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)pptVar1) {
        operator_delete(joined.
                        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((joined.
                                         super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                       ).
                                       super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                       .super__Tuple_impl<2UL,_unsigned_int>.
                                       super__Head_base<2UL,_unsigned_int,_false>._M_head_impl + 1))
        ;
      }
    }
    else {
      ConvertScaleKeys(this,(aiNodeAnim *)
                            na_00.
                            super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t
                            .super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                            super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl,
                       (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                        *)(chain[0xc]._M_node + 2),pLVar17,start,stop,max_time,min_time);
    }
    uVar5._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
    super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
    super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
         na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
         super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
         super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl;
    p_Var3 = chain[7]._M_node;
    if (p_Var3 == iter_end._M_node) {
      puVar15 = (undefined8 *)operator_new__(0x18);
      pLVar17 = (LayerMap *)0x0;
      *puVar15 = 0;
      puVar15[1] = 0x3f800000;
      puVar15[2] = 0;
      *(undefined8 **)
       ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
              super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
              super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x418) = puVar15;
      *(undefined4 *)
       ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
              super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
              super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x410) = 1;
      *puVar15 = 0;
      pptVar1 = &joined.
                 super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pptVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&joined,"Lcl Rotation","");
      translation.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      translation.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((ulong)translation.
                            super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish._4_4_ << 0x20);
      pPVar10 = PropertyTable::Get(this_00,(string *)&joined);
      if (pPVar10 == (Property *)0x0) {
        pLVar14 = (LayerMap *)&translation;
      }
      else {
        lVar11 = __dynamic_cast(pPVar10,&Property::typeinfo,
                                &TypedProperty<aiVector3t<float>>::typeinfo,0);
        pLVar17 = (LayerMap *)(lVar11 + 8);
        pLVar14 = (LayerMap *)&translation;
        if (lVar11 != 0) {
          pLVar14 = pLVar17;
        }
      }
      scaling.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = *(pointer *)&(pLVar14->_M_t)._M_impl;
      scaling.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)CONCAT44(scaling.
                             super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                             (pLVar14->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color);
      RVar8 = Model::RotationOrder(target);
      aVar20 = EulerToQuaternion((FBXConverter *)target,(aiVector3D *)&scaling,RVar8);
      *(aiQuaternion *)
       (*(long *)((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                        _M_t.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                        super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x418) + 8) =
           aVar20;
      if (joined.
          super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)pptVar1) {
        operator_delete(joined.
                        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((joined.
                                         super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                       ).
                                       super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                       .super__Tuple_impl<2UL,_unsigned_int>.
                                       super__Head_base<2UL,_unsigned_int,_false>._M_head_impl + 1))
        ;
      }
    }
    else {
      RVar8 = Model::RotationOrder(target);
      ConvertRotationKeys(this,(aiNodeAnim *)
                               uVar5._M_t.
                               super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>
                               .super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl,
                          (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                           *)(p_Var3 + 2),pLVar17,start,stop,max_time,min_time,RVar8);
    }
    if (chain[3]._M_node == iter_end._M_node) {
      puVar15 = (undefined8 *)operator_new__(0x18);
      *puVar15 = 0;
      puVar15[1] = 0;
      *(undefined4 *)(puVar15 + 2) = 0;
      *(undefined8 **)
       ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
              super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
              super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x408) = puVar15;
      *(undefined4 *)
       ((long)na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
              super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
              super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x404) = 1;
      *puVar15 = 0;
      pptVar1 = &joined.
                 super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
      joined.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pptVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&joined,"Lcl Translation","");
      scaling.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      scaling.
      super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((ulong)scaling.
                            super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish & 0xffffffff00000000);
      pPVar10 = PropertyTable::Get(this_00,(string *)&joined);
      if (pPVar10 == (Property *)0x0) {
        pKVar12 = &scaling;
      }
      else {
        lVar11 = __dynamic_cast(pPVar10,&Property::typeinfo,
                                &TypedProperty<aiVector3t<float>>::typeinfo,0);
        pKVar12 = &scaling;
        if (lVar11 != 0) {
          pKVar12 = (KeyFrameListList *)(lVar11 + 8);
        }
      }
      uVar9 = *(undefined4 *)
               &(pKVar12->
                super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      lVar11 = *(long *)((long)na._M_t.
                               super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>
                               .super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl + 0x408);
      *(pointer *)(lVar11 + 8) =
           (pKVar12->
           super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
      *(undefined4 *)(lVar11 + 0x10) = uVar9;
      if (joined.
          super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)pptVar1) {
        operator_delete(joined.
                        super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (ulong)((long)&((joined.
                                         super__Vector_base<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>,_std::allocator<std::tuple<std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                       super__Tuple_impl<0UL,_std::shared_ptr<std::vector<long,_std::allocator<long>_>_>,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                       ).
                                       super__Tuple_impl<1UL,_std::shared_ptr<std::vector<float,_std::allocator<float>_>_>,_unsigned_int>
                                       .super__Tuple_impl<2UL,_unsigned_int>.
                                       super__Head_base<2UL,_unsigned_int,_false>._M_head_impl + 1))
        ;
      }
    }
    else {
      ConvertTranslationKeys
                (this,(aiNodeAnim *)
                      na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>.
                      _M_t.super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
                      super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl,
                 (vector<const_Assimp::FBX::AnimationCurveNode_*,_std::allocator<const_Assimp::FBX::AnimationCurveNode_*>_>
                  *)(chain[3]._M_node + 2),pLVar17,start,stop,max_time,min_time);
    }
  }
  uVar5._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
       na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
       super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
       super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl;
  na._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
  super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
  super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiNodeAnim,_std::default_delete<aiNodeAnim>,_true,_true>)
       (__uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>)0x0;
  std::unique_ptr<aiNodeAnim,_std::default_delete<aiNodeAnim>_>::~unique_ptr(&na);
  return (aiNodeAnim *)
         (__uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>)
         uVar5._M_t.super___uniq_ptr_impl<aiNodeAnim,_std::default_delete<aiNodeAnim>_>._M_t.
         super__Tuple_impl<0UL,_aiNodeAnim_*,_std::default_delete<aiNodeAnim>_>.
         super__Head_base<0UL,_aiNodeAnim_*,_false>._M_head_impl;
}

Assistant:

aiNodeAnim* FBXConverter::GenerateSimpleNodeAnim(const std::string& name,
            const Model& target,
            NodeMap::const_iterator chain[TransformationComp_MAXIMUM],
            NodeMap::const_iterator iter_end,
            const LayerMap& layer_map,
            int64_t start, int64_t stop,
            double& max_time,
            double& min_time,
            bool reverse_order)

        {
            std::unique_ptr<aiNodeAnim> na(new aiNodeAnim());
            na->mNodeName.Set(name);

            const PropertyTable& props = target.Props();

            // need to convert from TRS order to SRT?
            if (reverse_order) {

                aiVector3D def_scale = PropertyGet(props, "Lcl Scaling", aiVector3D(1.f, 1.f, 1.f));
                aiVector3D def_translate = PropertyGet(props, "Lcl Translation", aiVector3D(0.f, 0.f, 0.f));
                aiVector3D def_rot = PropertyGet(props, "Lcl Rotation", aiVector3D(0.f, 0.f, 0.f));

                KeyFrameListList scaling;
                KeyFrameListList translation;
                KeyFrameListList rotation;

                if (chain[TransformationComp_Scaling] != iter_end) {
                    scaling = GetKeyframeList((*chain[TransformationComp_Scaling]).second, start, stop);
                }

                if (chain[TransformationComp_Translation] != iter_end) {
                    translation = GetKeyframeList((*chain[TransformationComp_Translation]).second, start, stop);
                }

                if (chain[TransformationComp_Rotation] != iter_end) {
                    rotation = GetKeyframeList((*chain[TransformationComp_Rotation]).second, start, stop);
                }

                KeyFrameListList joined;
                joined.insert(joined.end(), scaling.begin(), scaling.end());
                joined.insert(joined.end(), translation.begin(), translation.end());
                joined.insert(joined.end(), rotation.begin(), rotation.end());

                const KeyTimeList& times = GetKeyTimeList(joined);

                aiQuatKey* out_quat = new aiQuatKey[times.size()];
                aiVectorKey* out_scale = new aiVectorKey[times.size()];
                aiVectorKey* out_translation = new aiVectorKey[times.size()];

                if (times.size())
                {
                    ConvertTransformOrder_TRStoSRT(out_quat, out_scale, out_translation,
                        scaling,
                        translation,
                        rotation,
                        times,
                        max_time,
                        min_time,
                        target.RotationOrder(),
                        def_scale,
                        def_translate,
                        def_rot);
                }

                // XXX remove duplicates / redundant keys which this operation did
                // likely produce if not all three channels were equally dense.

                na->mNumScalingKeys = static_cast<unsigned int>(times.size());
                na->mNumRotationKeys = na->mNumScalingKeys;
                na->mNumPositionKeys = na->mNumScalingKeys;

                na->mScalingKeys = out_scale;
                na->mRotationKeys = out_quat;
                na->mPositionKeys = out_translation;
            }
            else {

                // if a particular transformation is not given, grab it from
                // the corresponding node to meet the semantics of aiNodeAnim,
                // which requires all of rotation, scaling and translation
                // to be set.
                if (chain[TransformationComp_Scaling] != iter_end) {
                    ConvertScaleKeys(na.get(), (*chain[TransformationComp_Scaling]).second,
                        layer_map,
                        start, stop,
                        max_time,
                        min_time);
                }
                else {
                    na->mScalingKeys = new aiVectorKey[1];
                    na->mNumScalingKeys = 1;

                    na->mScalingKeys[0].mTime = 0.;
                    na->mScalingKeys[0].mValue = PropertyGet(props, "Lcl Scaling",
                        aiVector3D(1.f, 1.f, 1.f));
                }

                if (chain[TransformationComp_Rotation] != iter_end) {
                    ConvertRotationKeys(na.get(), (*chain[TransformationComp_Rotation]).second,
                        layer_map,
                        start, stop,
                        max_time,
                        min_time,
                        target.RotationOrder());
                }
                else {
                    na->mRotationKeys = new aiQuatKey[1];
                    na->mNumRotationKeys = 1;

                    na->mRotationKeys[0].mTime = 0.;
                    na->mRotationKeys[0].mValue = EulerToQuaternion(
                        PropertyGet(props, "Lcl Rotation", aiVector3D(0.f, 0.f, 0.f)),
                        target.RotationOrder());
                }

                if (chain[TransformationComp_Translation] != iter_end) {
                    ConvertTranslationKeys(na.get(), (*chain[TransformationComp_Translation]).second,
                        layer_map,
                        start, stop,
                        max_time,
                        min_time);
                }
                else {
                    na->mPositionKeys = new aiVectorKey[1];
                    na->mNumPositionKeys = 1;

                    na->mPositionKeys[0].mTime = 0.;
                    na->mPositionKeys[0].mValue = PropertyGet(props, "Lcl Translation",
                        aiVector3D(0.f, 0.f, 0.f));
                }

            }
            return na.release();
        }